

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  uint uVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  unsigned_short *__src;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ImDrawCmd *pIVar11;
  int iVar12;
  
  if (1 < this->_ChannelsCount) {
    iVar12 = 0;
    ChannelsSetCurrent(this,0);
    uVar1 = (this->CmdBuffer).Size;
    if ((ulong)uVar1 != 0) {
      if ((int)uVar1 < 1) {
LAB_0010a4ab:
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                      ,0x4e1,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
      }
      if ((this->CmdBuffer).Data[(ulong)uVar1 - 1].ElemCount == 0) {
        (this->CmdBuffer).Size = uVar1 - 1;
      }
    }
    iVar2 = this->_ChannelsCount;
    iVar6 = 0;
    if (1 < (long)iVar2) {
      uVar1 = (this->_Channels).Size;
      pIVar3 = (this->_Channels).Data;
      uVar5 = 1;
      if (1 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      iVar6 = 0;
      lVar7 = 0x20;
      iVar12 = 0;
      do {
        if (uVar5 * 0x20 == lVar7) goto LAB_0010a48c;
        uVar1 = *(uint *)((long)&(pIVar3->CmdBuffer).Size + lVar7);
        if ((ulong)uVar1 != 0) {
          if ((int)uVar1 < 1) goto LAB_0010a4ab;
          if (*(int *)(*(long *)((long)&(pIVar3->CmdBuffer).Data + lVar7) + -0x30 +
                      (ulong)uVar1 * 0x30) == 0) {
            *(uint *)((long)&(pIVar3->CmdBuffer).Size + lVar7) = uVar1 - 1;
          }
        }
        iVar6 = iVar6 + *(int *)((long)&(pIVar3->CmdBuffer).Size + lVar7);
        iVar12 = iVar12 + *(int *)((long)&(pIVar3->IdxBuffer).Size + lVar7);
        lVar7 = lVar7 + 0x20;
      } while ((long)iVar2 * 0x20 != lVar7);
    }
    iVar8 = (this->CmdBuffer).Size + iVar6;
    iVar2 = (this->CmdBuffer).Capacity;
    if (iVar2 < iVar8) {
      if (iVar2 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar2 / 2 + iVar2;
      }
      if (iVar9 <= iVar8) {
        iVar9 = iVar8;
      }
      if (iVar2 < iVar9) {
        __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar9 * 0x30);
        pIVar11 = (this->CmdBuffer).Data;
        if (pIVar11 != (ImDrawCmd *)0x0) {
          memcpy(__dest,pIVar11,(long)(this->CmdBuffer).Size * 0x30);
          ImGui::MemFree((this->CmdBuffer).Data);
        }
        (this->CmdBuffer).Data = __dest;
        (this->CmdBuffer).Capacity = iVar9;
      }
    }
    (this->CmdBuffer).Size = iVar8;
    lVar7 = (long)(this->IdxBuffer).Size + (long)iVar12;
    iVar2 = (this->IdxBuffer).Capacity;
    iVar8 = (int)lVar7;
    if (iVar2 < iVar8) {
      if (iVar2 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar2 / 2 + iVar2;
      }
      if (iVar9 <= iVar8) {
        iVar9 = iVar8;
      }
      if (iVar2 < iVar9) {
        __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar9 * 2);
        __src = (this->IdxBuffer).Data;
        if (__src != (unsigned_short *)0x0) {
          memcpy(__dest_00,__src,(long)(this->IdxBuffer).Size * 2);
          ImGui::MemFree((this->IdxBuffer).Data);
        }
        (this->IdxBuffer).Data = __dest_00;
        (this->IdxBuffer).Capacity = iVar9;
      }
    }
    (this->IdxBuffer).Size = iVar8;
    pIVar11 = (this->CmdBuffer).Data;
    iVar2 = (this->CmdBuffer).Size;
    this->_IdxWritePtr = (this->IdxBuffer).Data + (lVar7 - iVar12);
    if (1 < this->_ChannelsCount) {
      pIVar11 = pIVar11 + ((long)iVar2 - (long)iVar6);
      lVar7 = 1;
      lVar10 = 0x38;
      do {
        if ((this->_Channels).Size <= lVar7) {
LAB_0010a48c:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                        ,0x4d7,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
        }
        pIVar3 = (this->_Channels).Data;
        lVar4 = (long)*(int *)((long)pIVar3 + lVar10 + -0x18);
        if (lVar4 != 0) {
          memcpy(pIVar11,*(void **)((long)pIVar3 + lVar10 + -0x10),lVar4 * 0x30);
          pIVar11 = pIVar11 + lVar4;
        }
        lVar4 = (long)*(int *)((long)pIVar3 + lVar10 + -8);
        if (lVar4 != 0) {
          memcpy(this->_IdxWritePtr,*(void **)((long)&(pIVar3->CmdBuffer).Size + lVar10),lVar4 * 2);
          this->_IdxWritePtr = this->_IdxWritePtr + lVar4;
        }
        lVar7 = lVar7 + 1;
        lVar10 = lVar10 + 0x20;
      } while (lVar7 < this->_ChannelsCount);
    }
    UpdateClipRect(this);
    this->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    _ChannelsCount = 1;
}